

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter_test.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::subject::SubjectFormatterTest_test_creating_basic_subject_from_string_Test
::TestBody(SubjectFormatterTest_test_creating_basic_subject_from_string_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  Subject subject;
  allocator<char> local_49;
  string local_48 [32];
  SubjectBuilder local_28 [8];
  SubjectBuilder builder;
  SubjectFormatterTest_test_creating_basic_subject_from_string_Test *this_local;
  
  bidfx_public_api::price::subject::SubjectBuilder::SubjectBuilder(local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_48,"Symbol=EURGBP,Quantity=2500000",&local_49);
  bidfx_public_api::price::subject::SubjectFormatter::ParseSubject
            ((string *)FORMATTER,(SubjectBuilder *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  bidfx_public_api::price::subject::SubjectBuilder::CreateSubject();
  bidfx_public_api::price::subject::Subject::ToString_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[31]>
            ((EqHelper<false> *)local_88,"subject.ToString()","\"Quantity=2500000,Symbol=EURGBP\"",
             &local_a8,(char (*) [31])"Quantity=2500000,Symbol=EURGBP");
  std::__cxx11::string::~string((string *)&local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/subject/subject_formatter_test.cpp"
               ,0x22,message);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  Subject::~Subject((Subject *)&gtest_ar.message_);
  SubjectBuilder::~SubjectBuilder(local_28);
  return;
}

Assistant:

TEST(SubjectFormatterTest, test_creating_basic_subject_from_string)
{
    SubjectBuilder builder = SubjectBuilder();
    FORMATTER.ParseSubject("Symbol=EURGBP,Quantity=2500000", builder);

    Subject subject = builder.CreateSubject();
    ASSERT_EQ(subject.ToString(), "Quantity=2500000,Symbol=EURGBP");
}